

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_page_element * nk_create_page_element(nk_context *ctx)

{
  uint uVar1;
  nk_page *pnVar2;
  nk_page_element *__s;
  ulong uVar3;
  ulong uVar4;
  nk_page_element *__s_00;
  
  __s = ctx->freelist;
  if (__s != (nk_page_element *)0x0) {
    ctx->freelist = __s->next;
    goto LAB_0011ecb3;
  }
  if (ctx->use_pool == 0) {
    __s = (nk_page_element *)nk_buffer_alloc(&ctx->memory,NK_BUFFER_BACK,0x1c8,8);
  }
  else {
    pnVar2 = (ctx->pool).pages;
    if ((pnVar2 == (nk_page *)0x0) || ((ctx->pool).capacity <= pnVar2->size)) {
      if ((ctx->pool).type == NK_BUFFER_FIXED) {
        __s = (nk_page_element *)0x0;
        goto joined_r0x0011edd4;
      }
      pnVar2 = (nk_page *)(*(ctx->pool).alloc.alloc)((ctx->pool).alloc.userdata,(void *)0x0,0x1d58);
      pnVar2->next = (ctx->pool).pages;
      (ctx->pool).pages = pnVar2;
      pnVar2->size = 0;
    }
    pnVar2 = (ctx->pool).pages;
    uVar1 = pnVar2->size;
    pnVar2->size = uVar1 + 1;
    __s = pnVar2->win + uVar1;
  }
joined_r0x0011edd4:
  if (__s == (nk_page_element *)0x0) {
    return (nk_page_element *)0x0;
  }
LAB_0011ecb3:
  uVar3 = (ulong)__s & 3;
  if (uVar3 == 0) {
    uVar4 = 0x1c8;
    __s_00 = __s;
  }
  else {
    memset(__s,0,4 - uVar3);
    uVar4 = uVar3 | 0x1c4;
    __s_00 = (nk_page_element *)((4 - uVar3) + (long)__s);
  }
  uVar3 = (ulong)((uint)uVar4 & 0xfffffffc);
  memset(__s_00,0,uVar3);
  if ((uVar4 & 3) != 0) {
    memset((void *)((long)&__s_00->data + uVar3),0,uVar4 & 3);
  }
  __s->next = (nk_page_element *)0x0;
  __s->prev = (nk_page_element *)0x0;
  return __s;
}

Assistant:

NK_INTERN struct nk_page_element*
nk_create_page_element(struct nk_context *ctx)
{
    struct nk_page_element *elem;
    if (ctx->freelist) {
        /* unlink page element from free list */
        elem = ctx->freelist;
        ctx->freelist = elem->next;
    } else if (ctx->use_pool) {
        /* allocate page element from memory pool */
        elem = nk_pool_alloc(&ctx->pool);
        NK_ASSERT(elem);
        if (!elem) return 0;
    } else {
        /* allocate new page element from the back of the fixed size memory buffer */
        NK_STORAGE const nk_size size = sizeof(struct nk_page_element);
        NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_page_element);
        elem = (struct nk_page_element*)nk_buffer_alloc(&ctx->memory, NK_BUFFER_BACK, size, align);
        NK_ASSERT(elem);
        if (!elem) return 0;
    }
    nk_zero_struct(*elem);
    elem->next = 0;
    elem->prev = 0;
    return elem;
}